

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cpp
# Opt level: O2

int __thiscall ncnn::Normalize::load_model(Normalize *this,ModelBin *mb)

{
  int iVar1;
  Mat local_60;
  
  (*mb->_vptr_ModelBin[2])(&local_60,mb,(ulong)(uint)this->scale_data_size,1);
  Mat::operator=(&this->scale_data,&local_60);
  Mat::~Mat(&local_60);
  if (((this->scale_data).data == (void *)0x0) ||
     (iVar1 = 0, (long)(this->scale_data).c * (this->scale_data).cstep == 0)) {
    iVar1 = -100;
  }
  return iVar1;
}

Assistant:

int Normalize::load_model(const ModelBin& mb)
{
    scale_data = mb.load(scale_data_size, 1);
    if (scale_data.empty())
        return -100;

    return 0;
}